

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O0

uint textToBin(char *text,unsigned_long text_sz)

{
  char cVar1;
  char *pcVar2;
  uint local_30;
  uint local_2c;
  uint i;
  uint sz;
  char *src;
  char *dst;
  unsigned_long text_sz_local;
  char *text_local;
  
  _i = text;
  src = text;
  dst = (char *)text_sz;
  text_sz_local = (unsigned_long)text;
  __isoc99_sscanf(text,"%u ",&local_2c);
  do {
    pcVar2 = _i + 1;
    cVar1 = *_i;
    _i = pcVar2;
  } while (cVar1 != ' ');
  for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 3) {
    *src = *_i - 0x30U | _i[1] * '@';
    src[1] = (byte)((int)_i[1] - 0x30U >> 2) | _i[2] * '\x10';
    src[2] = (byte)((int)_i[2] - 0x30U >> 4) | (_i[3] + -0x30) * '\x04';
    _i = _i + 4;
    src = src + 3;
  }
  return local_2c;
}

Assistant:

static unsigned textToBin(char* text, unsigned long text_sz)
{
    char*       dst = text;
    const char* src = text;
    unsigned sz, i;
    sscanf(src, "%u ", &sz);
    while(*src++ != ' ');
    for ( i = 0; i < sz; i += 3 )
    {
        dst[0] = (char)( (unsigned)src[0] - '0')       | (((unsigned)src[1] - '0') << 6);
        dst[1] = (char)(((unsigned)src[1] - '0') >> 2) | (((unsigned)src[2] - '0') << 4);
        dst[2] = (char)(((unsigned)src[2] - '0') >> 4) | (((unsigned)src[3] - '0') << 2);
        src += 4;
        dst += 3;
    }
    return sz;
}